

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper_template.h
# Opt level: O0

int compute_all_subq(uint64_t dst,uint64_t src2)

{
  byte bVar1;
  ulong uVar2;
  target_long tVar3;
  target_long tVar4;
  uint64_t src1;
  int of;
  int sf;
  int zf;
  int af;
  int pf;
  int cf;
  uint64_t src2_local;
  uint64_t dst_local;
  
  uVar2 = dst + src2;
  bVar1 = "\x04"[dst & 0xff];
  tVar3 = lshift(dst,-0x38);
  tVar4 = lshift((uVar2 ^ src2) & (uVar2 ^ dst),-0x34);
  return (uint)(uVar2 < src2 | bVar1) | ((uint)dst ^ (uint)uVar2 ^ (uint)src2) & 0x10 |
         (uint)(dst == 0) << 6 | (uint)tVar3 & 0x80 | (uint)tVar4 & 0x800;
}

Assistant:

static int glue(compute_all_sub, SUFFIX)(DATA_TYPE dst, DATA_TYPE src2)
{
    int cf, pf, af, zf, sf, of;
    DATA_TYPE src1 = dst + src2;

    cf = src1 < src2;
    pf = parity_table[(uint8_t)dst];
    af = (dst ^ src1 ^ src2) & CC_A;
    zf = (dst == 0) * CC_Z;
    sf = lshift(dst, 8 - DATA_BITS) & CC_S;
    of = lshift((src1 ^ src2) & (src1 ^ dst), 12 - DATA_BITS) & CC_O;
    return cf | pf | af | zf | sf | of;
}